

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O2

void __thiscall GOESRImageHandler::handle(GOESRImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
  *this_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  iterator iVar4;
  GOESRProduct *this_01;
  mapped_type *this_02;
  NOAALRITHeader NVar5;
  SegmentKey key;
  PrimaryHeader ph;
  GOESRProduct tmp;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_508;
  PrimaryHeader local_4a8;
  GOESRProduct local_490;
  GOESRProduct local_318;
  GOESRProduct local_1a0;
  
  lrit::File::getHeader<lrit::PrimaryHeader>
            (&local_4a8,(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  if (local_4a8.fileType != '\0') {
    return;
  }
  NVar5 = lrit::File::getHeader<lrit::NOAALRITHeader>
                    ((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((NVar5._8_4_ & 0xfffc | 2) != 0x12) {
    return;
  }
  bVar1 = lrit::hasHeader<lrit::AncillaryTextHeader>
                    (&((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->m_);
  if (!bVar1) {
    return;
  }
  GOESRProduct::GOESRProduct(&local_490,f);
  if ((((local_490.satelliteID_ != this->satelliteID_) ||
       (bVar1 = GOESRProduct::matchProduct(&local_490,&(this->config_).products), !bVar1)) ||
      (bVar1 = GOESRProduct::matchRegion(&local_490,&(this->config_).regions), !bVar1)) ||
     (bVar1 = GOESRProduct::matchChannel(&local_490,&(this->config_).channels), !bVar1))
  goto LAB_0018a336;
  if (local_490.segmented_ == false) {
    GOESRProduct::GOESRProduct(&local_1a0,&local_490);
    handleImage(this,&local_1a0);
    GOESRProduct::~GOESRProduct(&local_1a0);
    goto LAB_0018a336;
  }
  bVar1 = lrit::hasHeader<lrit::SegmentIdentificationHeader>
                    (&((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->m_);
  if (!bVar1) goto LAB_0018a336;
  GOESRProduct::generateKey_abi_cxx11_((SegmentKey *)&_Stack_508,&local_490);
  this_00 = &this->products_;
  iVar4 = std::
          _Hashtable<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)&_Stack_508);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_01 = std::__detail::
              _Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)&_Stack_508);
LAB_0018a2d1:
    GOESRProduct::operator=(this_01,&local_490);
  }
  else {
    uVar2 = GOESRProduct::imageIdentifier
                      ((GOESRProduct *)
                       ((long)iVar4.
                              super__Node_iterator_base<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_true>
                              ._M_cur + 0x68));
    uVar3 = GOESRProduct::imageIdentifier(&local_490);
    if (uVar2 != uVar3) {
      this_01 = std::__detail::
                _Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)&_Stack_508);
      goto LAB_0018a2d1;
    }
    GOESRProduct::add((GOESRProduct *)
                      ((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_true>
                             ._M_cur + 0x68),f);
  }
  this_02 = std::__detail::
            _Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_00,(key_type *)&_Stack_508);
  bVar1 = GOESRProduct::isComplete(this_02);
  if (bVar1) {
    GOESRProduct::GOESRProduct(&local_318,this_02);
    handleImage(this,&local_318);
    GOESRProduct::~GOESRProduct(&local_318);
    std::
    _Hashtable<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&this_00->_M_h,&_Stack_508);
  }
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl(&_Stack_508);
LAB_0018a336:
  GOESRProduct::~GOESRProduct(&local_490);
  return;
}

Assistant:

void GOESRImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter by product
  //
  // The NOAA product ID is equal to the GOES satellite number.
  // This is true for LRIT files from both GOES-16 and GOES-17,
  // which is reason to believe it will hold true for GOES-18
  // and GOES-19 as well (also see issue #122).
  //
  // Actual filtering based on satellite is done based on the details
  // encoded in the ancillary data field.
  //
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  auto pid = nlh.productID;
  if (!(pid == 16 || pid == 17 || pid == 18 || pid == 19)) {
    return;
  }

  // Require presence of ancillary text header.
  //
  // The details expect this header to be present. It appears not to
  // be present on products other than cloud and moisture image
  // products (included in the HRIT stream starting late May 2018).
  //
  // The first GOES-16 image file that did not have this header was
  // named: OR_ABI-L2-RRQPEF-M3_G16_[...]_rescaled.lrit and I saw it
  // on the stream on 2018-05-21T18:50:00Z.
  //
  if (!f->hasHeader<lrit::AncillaryTextHeader>()) {
    return;
  }

  auto tmp = GOESRProduct(f);

  // Filter by product details
  if (!tmp.matchSatelliteID(satelliteID_) ||
      !tmp.matchProduct(config_.products) ||
      !tmp.matchRegion(config_.regions) ||
      !tmp.matchChannel(config_.channels)) {
    return;
  }

  // If this is not a segmented image we can post process immediately
  if (!tmp.isSegmented()) {
    handleImage(std::move(tmp));
    return;
  }

  // For consistency, assume that every file where the details
  // indicate it is part of a segmented image has a segment
  // identification header.
  if (!f->hasHeader<lrit::SegmentIdentificationHeader>()) {
    return;
  }

  const auto key = tmp.generateKey();

  // Find existing product with this region and channel
  auto it = products_.find(key);
  if (it == products_.end()) {
    // No existing product found; use this one as the first one
    products_[key] = std::move(tmp);
  } else {
    // If the current segment has the same image identifier as the
    // segments we have seen before, add it. Otherwise, we can
    // safely assume the existing image is incomplete and we drop it.
    auto& product = it->second;
    if (product.imageIdentifier() == tmp.imageIdentifier()) {
      product.add(f);
    } else {
      // TODO: Log that we drop the existing image
      products_[key] = std::move(tmp);
    }
  }

  // If the product is complete we can post process it
  auto& product = products_[key];
  if (product.isComplete()) {
    handleImage(std::move(product));
    products_.erase(key);
    return;
  }
}